

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O0

pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> *
slang::ast::getGenerateBlockName(SyntaxNode *node)

{
  NamedLabelSyntax *pNVar1;
  NamedBlockClauseSyntax *pNVar2;
  SyntaxNode *in_RSI;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> *in_RDI;
  Token token_1;
  Token token;
  GenerateBlockSyntax *block;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> *__str;
  Token *local_88;
  Token *this;
  SourceLocation local_78;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  SourceLocation in_stack_ffffffffffffffa0;
  string_view local_58;
  Token local_48;
  SourceLocation local_38;
  string_view local_30;
  Token local_20;
  GenerateBlockSyntax *local_10;
  
  __str = in_RDI;
  if (in_RSI->kind == GenerateBlock) {
    this = local_88;
    local_10 = slang::syntax::SyntaxNode::as<slang::syntax::GenerateBlockSyntax>(in_RSI);
    if (local_10->label != (NamedLabelSyntax *)0x0) {
      pNVar1 = local_10->label;
      local_20.kind = (pNVar1->name).kind;
      local_20._2_1_ = (pNVar1->name).field_0x2;
      local_20.numFlags.raw = (pNVar1->name).numFlags.raw;
      local_20.rawLen = (pNVar1->name).rawLen;
      local_20.info = (pNVar1->name).info;
      local_30 = parsing::Token::valueText(this);
      local_38 = parsing::Token::location(&local_20);
      std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>::
      pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation,_true>
                (in_RDI,&local_30,&local_38);
      return __str;
    }
    if (local_10->beginName != (NamedBlockClauseSyntax *)0x0) {
      pNVar2 = local_10->beginName;
      local_48.kind = (pNVar2->name).kind;
      local_48._2_1_ = (pNVar2->name).field_0x2;
      local_48.numFlags.raw = (pNVar2->name).numFlags.raw;
      local_48.rawLen = (pNVar2->name).rawLen;
      local_48.info = (pNVar2->name).info;
      local_58 = parsing::Token::valueText(this);
      parsing::Token::location(&local_48);
      std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>::
      pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation,_true>
                (in_RDI,&local_58,(SourceLocation *)&stack0xffffffffffffffa0);
      return __str;
    }
  }
  local_70 = sv((char *)__str,(size_t)in_RDI);
  _local_88 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)in_stack_ffffffffffffffa0);
  local_78 = parsing::Token::location((Token *)&local_88);
  std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation,_true>
            (in_RDI,&local_70,&local_78);
  return __str;
}

Assistant:

static std::pair<std::string_view, SourceLocation> getGenerateBlockName(const SyntaxNode& node) {
    if (node.kind == SyntaxKind::GenerateBlock) {
        // Try to find a name for this block. Generate blocks allow the name to be specified twice
        // (for no good reason) so check both locations.
        const GenerateBlockSyntax& block = node.as<GenerateBlockSyntax>();
        if (block.label) {
            auto token = block.label->name;
            return {token.valueText(), token.location()};
        }

        if (block.beginName) {
            auto token = block.beginName->name;
            return {token.valueText(), token.location()};
        }
    }

    return {""sv, node.getFirstToken().location()};
}